

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-actions.h
# Opt level: O0

Result __thiscall
testing::Action<solitaire::interfaces::Button_&()>::Perform
          (Action<solitaire::interfaces::Button_&()> *this)

{
  bool bVar1;
  Button *pBVar2;
  Action<solitaire::interfaces::Button_&()> *this_local;
  
  bVar1 = IsDoDefault(this);
  if (bVar1) {
    internal::IllegalDoDefault
              ("/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/externalLibs/googletest/googlemock/include/gmock/gmock-actions.h"
               ,0x1f0);
  }
  pBVar2 = internal::Apply<std::function<solitaire::interfaces::Button&()>const&,std::tuple<>>
                     (&this->fun_,(tuple<> *)((long)&this_local + 7));
  return pBVar2;
}

Assistant:

Result Perform(ArgumentTuple args) const {
    if (IsDoDefault()) {
      internal::IllegalDoDefault(__FILE__, __LINE__);
    }
    return internal::Apply(fun_, ::std::move(args));
  }